

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmemory.h
# Opt level: O0

_acceptLangItem * __thiscall
icu_63::MaybeStackArray<_acceptLangItem,_4>::resize
          (MaybeStackArray<_acceptLangItem,_4> *this,int32_t newCapacity,int32_t length)

{
  _acceptLangItem *p;
  int32_t length_local;
  int32_t newCapacity_local;
  MaybeStackArray<_acceptLangItem,_4> *this_local;
  
  if (newCapacity < 1) {
    this_local = (MaybeStackArray<_acceptLangItem,_4> *)0x0;
  }
  else {
    this_local = (MaybeStackArray<_acceptLangItem,_4> *)uprv_malloc_63((long)newCapacity * 0xa8);
    if (this_local != (MaybeStackArray<_acceptLangItem,_4> *)0x0) {
      if (0 < length) {
        p._0_4_ = length;
        if (this->capacity < length) {
          p._0_4_ = this->capacity;
        }
        if (newCapacity < (int32_t)p) {
          p._0_4_ = newCapacity;
        }
        memcpy(this_local,this->ptr,(long)(int32_t)p * 0xa8);
      }
      releaseArray(this);
      this->ptr = (_acceptLangItem *)this_local;
      this->capacity = newCapacity;
      this->needToRelease = '\x01';
    }
  }
  return (_acceptLangItem *)this_local;
}

Assistant:

inline T *MaybeStackArray<T, stackCapacity>::resize(int32_t newCapacity, int32_t length) {
    if(newCapacity>0) {
#if U_DEBUG && defined(UPRV_MALLOC_COUNT)
      ::fprintf(::stderr,"MaybeStacArray (resize) alloc %d * %lu\n", newCapacity,sizeof(T));
#endif
        T *p=(T *)uprv_malloc(newCapacity*sizeof(T));
        if(p!=NULL) {
            if(length>0) {
                if(length>capacity) {
                    length=capacity;
                }
                if(length>newCapacity) {
                    length=newCapacity;
                }
                uprv_memcpy(p, ptr, (size_t)length*sizeof(T));
            }
            releaseArray();
            ptr=p;
            capacity=newCapacity;
            needToRelease=TRUE;
        }
        return p;
    } else {
        return NULL;
    }
}